

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall
Centaurus::ATNNode<wchar_t>::ATNNode
          (ATNNode<wchar_t> *this,ATNNode<wchar_t> *old,
          vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
          *transitions)

{
  pointer pwVar1;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001a7870;
  std::
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>::
  vector(&this->m_transitions,transitions);
  this->m_type = old->m_type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_001a5d30;
  (this->m_invoke).m_id._M_dataplus._M_p = (pointer)&(this->m_invoke).m_id.field_2;
  pwVar1 = (old->m_invoke).m_id._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&(this->m_invoke).m_id,pwVar1,pwVar1 + (old->m_invoke).m_id._M_string_length
            );
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a78f8;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states,
           &(old->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states);
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a78a0;
  (this->m_literal)._M_dataplus._M_p = (pointer)&(this->m_literal).field_2;
  pwVar1 = (old->m_literal)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->m_literal,pwVar1,pwVar1 + (old->m_literal)._M_string_length);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(const ATNNode<TCHAR>& old, std::vector<ATNTransition<TCHAR> >&& transitions)
        : m_transitions(transitions), m_type(old.m_type), m_invoke(old.m_invoke), m_nfa(old.m_nfa), m_literal(old.m_literal), m_localid(old.m_localid)
    {
    }